

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

char * XPMPLoadCSLPackage(char *inCSLFolder)

{
  undefined8 uVar1;
  long in_RDI;
  string *path;
  allocator<char> local_89;
  string local_88 [8];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_51;
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  string local_30 [40];
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = "<nullptr> provided";
  }
  else {
    if (XPMP2::glob < 2) {
      path = (string *)&local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      XPMP2::StripXPSysDir(path);
      uVar1 = std::__cxx11::string::c_str();
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                    ,0xf8,"XPMPLoadCSLPackage",logINFO,"Loading CSL package from %s",uVar1);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    local_8 = XPMP2::CSLModelsLoad((string *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return local_8;
}

Assistant:

const char *    XPMPLoadCSLPackage(const char * inCSLFolder)
{
    // Do load the CSL Models in the given path
    if (inCSLFolder) {
        LOG_MSG(logINFO, INFO_LOAD_CSL_PACKAGE, StripXPSysDir(inCSLFolder).c_str());
        return CSLModelsLoad(inCSLFolder);
    }
    else
        return "<nullptr> provided";
}